

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  JBLOCKROW paJVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar3[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if ((pjVar3[1].insufficient_data != -1) && (0 < cinfo->blocks_in_MCU)) {
    lVar9 = 0;
    do {
      paJVar4 = MCU_data[lVar9];
      lVar12 = (long)cinfo->MCU_membership[lVar9];
      iVar2 = cinfo->cur_comp_info[lVar12]->dc_tbl_no;
      p_Var10 = (&pjVar3[3].decode_mcu)[iVar2] +
                *(int *)((long)&pjVar3[2].decode_mcu + lVar12 * 4 + 4);
      iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
      if (iVar6 == 0) {
        *(undefined4 *)((long)&pjVar3[2].decode_mcu + lVar12 * 4 + 4) = 0;
      }
      else {
        uVar7 = arith_decode(cinfo,(uchar *)(p_Var10 + 1));
        p_Var10 = p_Var10 + (ulong)uVar7 + 2;
        iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
        uVar13 = 0;
        if (iVar6 != 0) {
          p_Var10 = (&pjVar3[3].decode_mcu)[iVar2] + 0x14;
          iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
          uVar13 = 1;
          while (iVar6 != 0) {
            uVar13 = uVar13 * 2;
            if (uVar13 == 0x8000) {
              pjVar5 = cinfo->err;
              pjVar5->msg_code = 0x7e;
              (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
              pjVar3[1].insufficient_data = -1;
              return 1;
            }
            p_Var10 = p_Var10 + 1;
            iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
          }
        }
        iVar6 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar2] & 0x3f)) >> 1) <= (int)uVar13) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar2] & 0x3f)) >> 1) < (int)uVar13) {
            iVar6 = uVar7 * 4 + 0xc;
          }
          else {
            iVar6 = uVar7 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar3[2].decode_mcu + lVar12 * 4 + 4) = iVar6;
        uVar11 = uVar13;
        if (1 < uVar13) {
          do {
            uVar13 = (int)uVar13 >> 1;
            uVar8 = arith_decode(cinfo,(uchar *)(p_Var10 + 0xe));
            if (uVar8 != 0) {
              uVar8 = uVar13;
            }
            uVar11 = uVar11 | uVar8;
          } while (1 < uVar13);
        }
        uVar13 = ~uVar11;
        if (uVar7 == 0) {
          uVar13 = uVar11 + 1;
        }
        *(uint *)(&pjVar3[1].field_0x14 + lVar12 * 4) =
             uVar13 + *(int *)(&pjVar3[1].field_0x14 + lVar12 * 4) & 0xffff;
      }
      (*paJVar4)[0] =
           (short)*(undefined4 *)(&pjVar3[1].field_0x14 + lVar12 * 4) << ((byte)cinfo->Al & 0x3f);
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF)LEFT_SHIFT(entropy->last_dc_val[ci], cinfo->Al);
  }

  return TRUE;
}